

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O3

Variable *
skiwi::make_variable
          (Variable *__return_storage_ptr__,
          vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens)

{
  int iVar1;
  int column_nr;
  pointer pcVar2;
  pointer ptVar3;
  pointer ptVar4;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  string local_50;
  
  ptVar4 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
           super__Vector_impl_data._M_start;
  ptVar3 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (ptVar4 == ptVar3) {
    anon_unknown_2::throw_parse_error(no_tokens);
    ptVar4 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
             super__Vector_impl_data._M_start;
    ptVar3 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if ((ptVar4 == ptVar3) || (ptVar3[-1].type != T_ID)) {
    iVar1 = ptVar3[-1].line_nr;
    column_nr = ptVar3[-1].column_nr;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    anon_unknown_2::throw_parse_error(iVar1,column_nr,bad_syntax,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->tail_position = false;
  __return_storage_ptr__->pre_scan_index = 0;
  __return_storage_ptr__->scan_index = 0;
  (__return_storage_ptr__->filename)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->filename).field_2;
  (__return_storage_ptr__->filename)._M_string_length = 0;
  (__return_storage_ptr__->filename).field_2._M_local_buf[0] = '\0';
  ptVar4 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar1 = ptVar4[-1].column_nr;
  __return_storage_ptr__->line_nr = ptVar4[-1].line_nr;
  __return_storage_ptr__->column_nr = iVar1;
  if ((tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
      super__Vector_impl_data._M_start == ptVar4) {
    local_70 = &local_60;
    local_68 = 0;
    local_60 = 0;
  }
  else {
    local_70 = &local_60;
    pcVar2 = ptVar4[-1].value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + ptVar4[-1].value._M_string_length);
  }
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,(string *)&local_70);
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  anon_unknown_2::advance(tokens);
  return __return_storage_ptr__;
}

Assistant:

Variable make_variable(std::vector<token>& tokens)
  {
  if (tokens.empty())
    throw_parse_error(no_tokens);
  if (current_type(tokens) != token::T_ID)
    throw_parse_error(tokens.back().line_nr, tokens.back().column_nr, bad_syntax);
  Variable v;
  v.line_nr = tokens.back().line_nr;
  v.column_nr = tokens.back().column_nr;
  v.name = current(tokens);
  advance(tokens);
  return v;
  }